

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,LabelStatement *label_statement)

{
  LabelStatement *this_00;
  Label LStack_38;
  
  this_00 = (LabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&LStack_38,(string *)&label_statement->label_);
  LabelStatement::LabelStatement(this_00,&LStack_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  std::__cxx11::string::~string((string *)&LStack_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(LabelStatement* label_statement) {
  tos_value_.statement_ = new LabelStatement(label_statement->label_);
}